

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationDriveline.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMotorRotationDriveline::IntLoadConstraint_C
          (ChLinkMotorRotationDriveline *this,uint off_L,ChVectorDynamic<> *Qc,double c,
          bool do_clamp,double recovery_clamp)

{
  int iVar1;
  undefined1 auVar2 [16];
  Scalar *pSVar3;
  undefined7 in_register_00000009;
  undefined1 auVar4 [16];
  double dVar5;
  undefined8 in_XMM1_Qb;
  undefined1 auVar6 [16];
  double local_40;
  
  ChLinkMateGeneric::IntLoadConstraint_C
            ((ChLinkMateGeneric *)this,off_L,Qc,c,do_clamp,recovery_clamp);
  iVar1 = (this->super_ChLinkMotorRotation).super_ChLinkMotor.super_ChLinkMateGeneric.mask.nconstr;
  dVar5 = (double)(**(code **)(*(long *)&(this->super_ChLinkMotorRotation).super_ChLinkMotor.
                                         super_ChLinkMateGeneric.super_ChLinkMate.super_ChLink.
                                         super_ChLinkBase.super_ChPhysicsItem + 600))(this);
  local_40 = (dVar5 - (*(double *)(*(long *)&(this->super_ChLinkMotorRotation).field_0x278 + 0x88) -
                      ((this->innershaft2).
                       super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pos)
             ) * c;
  if ((int)CONCAT71(in_register_00000009,do_clamp) != 0) {
    auVar2._8_8_ = in_XMM1_Qb;
    auVar2._0_8_ = recovery_clamp;
    auVar4._8_8_ = 0x8000000000000000;
    auVar4._0_8_ = 0x8000000000000000;
    auVar4 = vxorpd_avx512vl(auVar2,auVar4);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_40;
    auVar4 = vmaxsd_avx(auVar6,auVar4);
    auVar4 = vminsd_avx(auVar4,auVar2);
    local_40 = auVar4._0_8_;
  }
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                      (ulong)(iVar1 + off_L));
  *pSVar3 = local_40 + *pSVar3;
  return;
}

Assistant:

void ChLinkMotorRotationDriveline::IntLoadConstraint_C(const unsigned int off_L,
                                       ChVectorDynamic<>& Qc,
                                       const double c,
                                       bool do_clamp,
                                       double recovery_clamp) {
    // First, inherit to parent class
    ChLinkMotorRotation::IntLoadConstraint_C(off_L, Qc, c, do_clamp, recovery_clamp);

    int nc = mask.nconstr;
    // the following always set zero C, so skip them ...
    //innerconstraint1->IntLoadConstraint_C(off_L + nc + 0, Qc, c, do_clamp, recovery_clamp);
    //innerconstraint2->IntLoadConstraint_C(off_L + nc + 1, Qc, c, do_clamp, recovery_clamp);
    // ...and compute custom violation C:
    double cnstr_rot_error =  this->GetMotorRot() - (this->innershaft1->GetPos() - this->innershaft2->GetPos());

    double cnstr_violation = c * cnstr_rot_error;

    if (do_clamp)
        cnstr_violation = ChMin(ChMax(cnstr_violation, -recovery_clamp), recovery_clamp);

    // lump violation in the 1st shaft-3D-1D constraints:
    Qc(off_L + nc + 0) += cnstr_violation;

}